

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall
Catch::Session::applyCommandLine(Session *this,int argc,char **argv,DoWhat unusedOptionBehaviour)

{
  Config *pCVar1;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> local_b8;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> local_98 [5];
  
  Clara::CommandLine<Catch::ConfigData>::parseInto
            (&local_b8,&this->m_cli,argc,argv,&this->m_configData);
  local_98[0].super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_unusedTokens).
       super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_98[0].super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_unusedTokens).
       super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_98[0].super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_unusedTokens).
       super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_unusedTokens).
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_unusedTokens).
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->m_unusedTokens).
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(local_98);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(&local_b8);
  if (unusedOptionBehaviour == Fail) {
    enforceNoUsedTokens(this);
  }
  if ((this->m_configData).showHelp == true) {
    showHelp(this,&(this->m_configData).processName);
  }
  pCVar1 = (this->m_config).m_p;
  if (pCVar1 != (Config *)0x0) {
    (*(pCVar1->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  (this->m_config).m_p = (Config *)0x0;
  return 0;
}

Assistant:

int applyCommandLine( int argc, char* const argv[], OnUnusedOptions::DoWhat unusedOptionBehaviour = OnUnusedOptions::Fail ) {
            try {
                m_unusedTokens = m_cli.parseInto( argc, argv, m_configData );
                if( unusedOptionBehaviour == OnUnusedOptions::Fail )
                    enforceNoUsedTokens();
                if( m_configData.showHelp )
                    showHelp( m_configData.processName );
                m_config.reset();
            }
            catch( std::exception& ex ) {
                {
                    Colour colourGuard( Colour::Red );
                    std::cerr   << "\nError in input:\n"
                                << Text( ex.what(), TextAttributes().setIndent(2) )
                                << "\n\n";
                }
                m_cli.usage( std::cout, m_configData.processName );
                return (std::numeric_limits<int>::max)();
            }
            return 0;
        }